

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialUnion.cpp
# Opt level: O2

void __thiscall dgrminer::PartialUnion::printEncoding(PartialUnion *this)

{
  ostream *poVar1;
  iterator iVar2;
  _Base_ptr p_Var3;
  _Self __tmp;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"LABELING:");
  std::endl<char,std::char_traits<char>>(poVar1);
  for (p_Var3 = (this->labelEncoding)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->labelEncoding)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)(p_Var3 + 1));
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,p_Var3[2]._M_color);
    poVar1 = std::operator<<(poVar1," (OLD: ");
    iVar2 = std::
            _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
            ::find(&(this->antecedentLabelsOfLabels)._M_t,(key_type *)(p_Var3 + 2));
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)&iVar2._M_node[1].field_0x4);
    poVar1 = std::operator<<(poVar1,")");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  return;
}

Assistant:

void PartialUnion::printEncoding()
	{
		cout << "LABELING:" << endl;
		std::map<std::string, int>::iterator i;
		for (i = labelEncoding.begin(); i != labelEncoding.end(); i++)
		{
			std::cout << i->first << " " << i->second << " (OLD: " << antecedentLabelsOfLabels.find(i->second)->second << ")" << std::endl;
		}
	}